

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

void __thiscall
fasttext::FastText::trainThread(FastText *this,int32_t threadId,TrainCallback *callback)

{
  model_name mVar1;
  int32_t iVar2;
  int64_t iVar3;
  element_type *peVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  float fVar8;
  real rVar9;
  int64_t eta;
  double lr;
  double wst;
  vector<int,_std::allocator<int>_> labels;
  int64_t *local_2c8;
  double *local_2c0;
  double *local_2b8;
  State state;
  vector<int,_std::allocator<int>_> line;
  tuple<long,_double,_double> local_250;
  ifstream ifs;
  
  std::ifstream::ifstream
            (&ifs,(string *)
                  &((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->input,_S_in);
  iVar3 = utils::size(&ifs);
  utils::seek(&ifs,(iVar3 * threadId) /
                   (long)((this->args_).
                          super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                         thread);
  iVar2 = ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->dim
  ;
  iVar3 = Matrix::size((this->output_).
                       super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr,0);
  Model::State::State(&state,iVar2,(int32_t)iVar3,
                      ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->seed + threadId);
  iVar3 = Dictionary::ntokens((this->dict_).
                              super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr);
  uVar5 = 0;
  line.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  labels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  labels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  labels.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  line.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  line.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  do {
    lVar7 = 0;
    uVar6 = uVar5;
    do {
      do {
        if ((((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             epoch * iVar3 <= (this->tokenCount_).super___atomic_base<long>._M_i) ||
           ((this->trainException_)._M_exception_object != (void *)0x0)) {
          if (threadId == 0) {
            rVar9 = Model::State::getLoss(&state);
            LOCK();
            (this->loss_)._M_i = rVar9;
            UNLOCK();
          }
          std::ifstream::close();
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    (&labels.super__Vector_base<int,_std::allocator<int>_>);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    (&line.super__Vector_base<int,_std::allocator<int>_>);
          Model::State::~State(&state);
          std::ifstream::~ifstream(&ifs);
          return;
        }
        peVar4 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        fVar8 = (float)(this->tokenCount_).super___atomic_base<long>._M_i /
                (float)(peVar4->epoch * iVar3);
        uVar5 = uVar6;
        if (((callback->super__Function_base)._M_manager != (_Manager_type)0x0) &&
           (uVar5 = uVar6 + 1, (uVar6 & 0x3f) == 0)) {
          progressInfo(&local_250,this,fVar8);
          local_2c8 = &eta;
          local_2c0 = &lr;
          local_2b8 = &wst;
          std::tuple<double&,double&,long&>::operator=
                    ((tuple<double&,double&,long&> *)&local_2c8,&local_250);
          std::function<void_(float,_float,_double,_double,_long)>::operator()
                    (callback,fVar8,(this->loss_)._M_i,wst,lr,eta);
          peVar4 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
        }
        mVar1 = peVar4->model;
        fVar8 = (float)((1.0 - (double)fVar8) * peVar4->lr);
        if (mVar1 == cbow) {
          iVar2 = Dictionary::getLine((this->dict_).
                                      super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr,(istream *)&ifs,&line,&state.rng);
          cbow(this,&state,fVar8,&line);
LAB_0013fa0f:
          lVar7 = lVar7 + iVar2;
        }
        else {
          if (mVar1 == sg) {
            iVar2 = Dictionary::getLine((this->dict_).
                                        super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr,(istream *)&ifs,&line,&state.rng);
            skipgram(this,&state,fVar8,&line);
            goto LAB_0013fa0f;
          }
          if (mVar1 == sup) {
            iVar2 = Dictionary::getLine((this->dict_).
                                        super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr,(istream *)&ifs,&line,&labels);
            supervised(this,&state,fVar8,&line,&labels);
            goto LAB_0013fa0f;
          }
        }
        uVar6 = uVar5;
      } while (lVar7 <= ((this->args_).
                         super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        lrUpdateRate);
      LOCK();
      (this->tokenCount_).super___atomic_base<long>._M_i =
           (this->tokenCount_).super___atomic_base<long>._M_i + lVar7;
      UNLOCK();
      lVar7 = 0;
    } while ((threadId != 0) ||
            (lVar7 = 0,
            ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            verbose < 2));
    rVar9 = Model::State::getLoss(&state);
    LOCK();
    (this->loss_)._M_i = rVar9;
    UNLOCK();
  } while( true );
}

Assistant:

void FastText::trainThread(int32_t threadId, const TrainCallback& callback) {
  std::ifstream ifs(args_->input);
  utils::seek(ifs, threadId * utils::size(ifs) / args_->thread);

  Model::State state(args_->dim, output_->size(0), threadId + args_->seed);

  const int64_t ntokens = dict_->ntokens();
  int64_t localTokenCount = 0;
  std::vector<int32_t> line, labels;
  uint64_t callbackCounter = 0;
  try {
    while (keepTraining(ntokens)) {
      real progress = real(tokenCount_) / (args_->epoch * ntokens);
      if (callback && ((callbackCounter++ % 64) == 0)) {
        double wst;
        double lr;
        int64_t eta;
        std::tie<double, double, int64_t>(wst, lr, eta) =
            progressInfo(progress);
        callback(progress, loss_, wst, lr, eta);
      }
      real lr = args_->lr * (1.0 - progress);
      if (args_->model == model_name::sup) {
        localTokenCount += dict_->getLine(ifs, line, labels);
        supervised(state, lr, line, labels);
      } else if (args_->model == model_name::cbow) {
        localTokenCount += dict_->getLine(ifs, line, state.rng);
        cbow(state, lr, line);
      } else if (args_->model == model_name::sg) {
        localTokenCount += dict_->getLine(ifs, line, state.rng);
        skipgram(state, lr, line);
      }
      if (localTokenCount > args_->lrUpdateRate) {
        tokenCount_ += localTokenCount;
        localTokenCount = 0;
        if (threadId == 0 && args_->verbose > 1) {
          loss_ = state.getLoss();
        }
      }
    }
  } catch (DenseMatrix::EncounteredNaNError&) {
    trainException_ = std::current_exception();
  }
  if (threadId == 0)
    loss_ = state.getLoss();
  ifs.close();
}